

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

QTimeZone * __thiscall
QDateTimeEditPrivate::stepBy(QDateTimeEditPrivate *this,int sectionIndex,int steps,bool test)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Int IVar4;
  uint uVar5;
  Int IVar6;
  int iVar7;
  QDateTimeEdit *pQVar8;
  undefined8 *puVar9;
  int *piVar10;
  long lVar11;
  int in_ECX;
  uint in_EDX;
  QDateTimeEditPrivate *in_RSI;
  QTimeZone *in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  bool maxcmp_1;
  bool mincmp_1;
  bool maxcmp;
  bool mincmp;
  int adds_1;
  int adds;
  int localmax;
  int localmin;
  qint64 msecsSinceEpoch;
  int span;
  int first;
  int max;
  int min;
  int val;
  QDateTimeEdit *q;
  QDateTime t_1;
  QDateTime t;
  int daysInMonth_1;
  int daysInMonth;
  QDateTime maximumDateTime;
  QDateTime minimumDateTime;
  int oldDay;
  SectionNode sn;
  int pos;
  QString str;
  QDateTime v;
  QDateTime *in_stack_fffffffffffffcc8;
  QDateTime *this_00;
  QDateTime *in_stack_fffffffffffffcd0;
  QVariant *this_01;
  int *in_stack_fffffffffffffcd8;
  QVariant *this_02;
  int *in_stack_fffffffffffffce0;
  QDateTime *this_03;
  int local_318;
  int local_2e0;
  bool local_2a5;
  bool local_282;
  bool local_281;
  int local_274;
  int local_270;
  int local_26c;
  int local_268;
  bool local_234;
  bool local_233;
  bool local_232;
  bool local_231;
  int local_204;
  QDateTime local_1d8 [8];
  QDateTime local_1d0 [8];
  undefined1 *local_1c8;
  QDateTime local_1c0 [8];
  undefined1 *local_1b8;
  QFlagsStorageHelper<QDateTimeParser::Section,_4> local_1ac;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  QDateTime local_188 [8];
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  int local_14c;
  QFlagsStorageHelper<QDateTimeEdit::Section,_4> local_148;
  QFlagsStorageHelper<QDateTimeParser::Section,_4> local_144;
  undefined8 local_140;
  undefined8 local_138;
  QDateTime local_130 [8];
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  int local_f8;
  QFlagsStorageHelper<QDateTimeEdit::Section,_4> local_f4;
  QFlagsStorageHelper<QDateTimeParser::Section,_4> local_f0;
  QFlagsStorageHelper<QDateTimeParser::Section,_4> local_ec;
  undefined1 *local_e8;
  undefined1 *local_e0;
  QTimeZone local_d8;
  QDateTime local_d0 [12];
  QFlagsStorageHelper<QDateTimeParser::Section,_4> local_c4;
  undefined8 local_c0;
  undefined8 local_b8;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  QLocale local_a0;
  QFlagsStorageHelper<QDateTimeParser::Section,_4> local_94;
  QDateTime local_90 [8];
  QDateTime local_88 [12];
  undefined1 *local_7c;
  undefined1 *local_74;
  int local_6c;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = q_func(in_RSI);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::toDateTime();
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)&(in_RSI->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0x110))
            (&local_68);
  local_6c = QLineEdit::cursorPosition((QLineEdit *)in_stack_fffffffffffffcd0);
  local_7c = &DAT_aaaaaaaaaaaaaaaa;
  local_74 = &DAT_aaaaaaaaaaaaaaaa;
  iVar7 = (int)in_RSI;
  puVar9 = (undefined8 *)QDateTimeParser::sectionNode(iVar7 + 0x3d8);
  local_7c = (undefined1 *)*puVar9;
  local_74 = (undefined1 *)puVar9[1];
  if ((((in_R8B & 1) == 0) &&
      ((*(ushort *)&(in_RSI->super_QAbstractSpinBoxPrivate).field_0x3d0 & 1) != 0)) &&
     (iVar3 = (**(code **)(*(long *)&(pQVar8->super_QAbstractSpinBox).super_QWidget + 0x1a0))
                        (pQVar8,&local_68,&local_6c), iVar3 == 2)) {
    (**(code **)(*(long *)&(pQVar8->super_QAbstractSpinBox).super_QWidget + 0x1d0))
              (local_88,pQVar8,&local_68);
    QDateTime::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    QDateTime::~QDateTime(local_88);
  }
  local_204 = QDateTimeParser::getDigit((QDateTime *)&in_RSI->super_QDateTimeParser,(int)&local_50);
  local_270 = QDateTimeParser::absoluteMin(iVar7 + 0x3d8);
  ::QVariant::toDateTime();
  local_274 = QDateTimeParser::absoluteMax(iVar7 + 0x3d8,(QDateTime *)(ulong)in_EDX);
  QDateTime::~QDateTime(local_90);
  local_94.super_QFlagsStorage<QDateTimeParser::Section>.i =
       (QFlagsStorage<QDateTimeParser::Section>)
       ::operator&((enum_type)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                   (enum_type)in_stack_fffffffffffffcd0);
  IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_94);
  if (IVar4 == 0) {
    local_204 = in_ECX + local_204;
    iVar7 = (local_274 - local_270) + 1;
    if (local_204 < local_270) {
      if ((*(ushort *)&(in_RSI->super_QAbstractSpinBoxPrivate).field_0x3d0 >> 2 & 1) != 0) {
        local_270 = local_204 + iVar7;
      }
      local_204 = local_270;
    }
    else if (local_274 < local_204) {
      if ((*(ushort *)&(in_RSI->super_QAbstractSpinBoxPrivate).field_0x3d0 >> 2 & 1) != 0) {
        local_274 = local_204 - iVar7;
      }
      local_204 = local_274;
    }
  }
  else {
    if ((*(ushort *)&(in_RSI->super_QAbstractSpinBoxPrivate).field_0x3d0 >> 2 & 1) == 0) {
      (**(code **)(*(long *)&(in_RSI->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0x128))
                (&local_a0);
      local_26c = QLocale::firstDayOfWeek();
      QLocale::~QLocale(&local_a0);
      local_268 = local_26c;
      if (local_204 < local_26c) {
        local_268 = local_26c + -7;
      }
      local_a4 = local_268;
      local_a8 = local_204 + in_ECX;
      if (local_204 < local_26c) {
        local_26c = local_26c + -1;
      }
      else {
        local_26c = local_26c + 6;
      }
      local_ac = local_26c;
      piVar10 = qBound<int>(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                            (int *)in_stack_fffffffffffffcd0);
      local_204 = *piVar10;
    }
    else {
      local_204 = in_ECX + local_204;
    }
    local_204 = local_204 % 7;
    if (local_204 < 1) {
      local_204 = local_204 + 7;
    }
  }
  local_b8 = QDateTime::date();
  local_c0 = *(undefined8 *)&in_RSI->field_0x468;
  local_b0 = QDate::day(&local_b8,local_c0);
  uVar5 = QDateTimeParser::setDigit
                    ((QDateTime *)&in_RSI->super_QDateTimeParser,(int)&local_50,in_EDX);
  bVar1 = false;
  if ((uVar5 & 1) != 0) {
    iVar7 = QDateTimeParser::getDigit((QDateTime *)&in_RSI->super_QDateTimeParser,(int)&local_50);
    bVar1 = false;
    if (iVar7 != local_204) {
      local_c4.super_QFlagsStorage<QDateTimeParser::Section>.i =
           (QFlagsStorage<QDateTimeParser::Section>)
           ::operator&((enum_type)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                       (enum_type)in_stack_fffffffffffffcd0);
      IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c4);
      bVar1 = false;
      if (IVar4 != 0) {
        bVar1 = in_ECX < 0;
      }
    }
  }
  if (bVar1) {
    lVar11 = QDateTime::toMSecsSinceEpoch();
    QDateTime::timeRepresentation();
    QDateTime::fromMSecsSinceEpoch((longlong)local_d0,(QTimeZone *)(lVar11 + -3600000));
    QDateTime::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    QDateTime::~QDateTime(local_d0);
    QTimeZone::~QTimeZone(&local_d8);
  }
  local_e0 = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::toDateTime();
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::toDateTime();
  local_281 = false;
  if ((int)local_7c != 1) {
    local_ec.super_QFlagsStorage<QDateTimeParser::Section>.i =
         (QFlagsStorage<QDateTimeParser::Section>)
         ::operator&((enum_type)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                     (enum_type)in_stack_fffffffffffffcd0);
    bVar1 = QFlags<QDateTimeParser::Section>::operator!
                      ((QFlags<QDateTimeParser::Section> *)&local_ec);
    local_281 = false;
    if (bVar1) {
      bVar1 = ::operator<(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      local_282 = true;
      if (!bVar1) {
        local_282 = operator>(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      }
      local_281 = local_282;
    }
  }
  if (local_281 != false) {
    QDateTimeParser::getDigit((QDateTime *)&in_RSI->super_QDateTimeParser,(int)&local_e0);
    QDateTimeParser::getDigit((QDateTime *)&in_RSI->super_QDateTimeParser,(int)&local_e8);
    if ((*(ushort *)&(in_RSI->super_QAbstractSpinBoxPrivate).field_0x3d0 >> 2 & 1) == 0) {
      QDateTimeParser::setDigit((QDateTime *)&in_RSI->super_QDateTimeParser,(int)&local_50,in_EDX);
    }
    else if (in_ECX < 1) {
      QDateTimeParser::setDigit((QDateTime *)&in_RSI->super_QDateTimeParser,(int)&local_50,in_EDX);
      local_144.super_QFlagsStorage<QDateTimeParser::Section>.i =
           (QFlagsStorage<QDateTimeParser::Section>)
           ::operator&((enum_type)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                       (enum_type)in_stack_fffffffffffffcd0);
      bVar2 = QFlags<QDateTimeParser::Section>::operator!
                        ((QFlags<QDateTimeParser::Section> *)&local_144);
      bVar1 = false;
      if (bVar2) {
        local_148.super_QFlagsStorage<QDateTimeEdit::Section>.i =
             (QFlagsStorage<QDateTimeEdit::Section>)
             QFlags<QDateTimeEdit::Section>::operator&
                       ((QFlags<QDateTimeEdit::Section> *)in_stack_fffffffffffffcd0,
                        (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
        IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_148);
        bVar1 = IVar6 != 0;
      }
      if (bVar1) {
        local_158 = QDateTime::date();
        local_160 = *(undefined8 *)&in_RSI->field_0x468;
        local_14c = QDate::daysInMonth(&local_158,local_160);
        local_168 = QDateTime::date();
        local_170 = *(undefined8 *)&in_RSI->field_0x468;
        iVar7 = QDate::day(&local_168,local_170);
        bVar1 = false;
        if (iVar7 < local_b0) {
          local_178 = QDateTime::date();
          local_180 = *(undefined8 *)&in_RSI->field_0x468;
          iVar7 = QDate::day(&local_178,local_180);
          bVar1 = iVar7 < local_14c;
        }
        if (bVar1) {
          qMin<int>(&local_b0,&local_14c);
          local_190 = QDateTime::date();
          local_198 = *(undefined8 *)&in_RSI->field_0x468;
          QDate::day(&local_190,local_198);
          QDateTime::addDays((longlong)local_188);
          QDateTime::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
          QDateTime::~QDateTime(local_188);
        }
      }
      bVar1 = operator>(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      if (bVar1) {
        QDateTimeParser::setDigit((QDateTime *)&in_RSI->super_QDateTimeParser,(int)&local_50,in_EDX)
        ;
        bVar1 = operator>(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
        if (bVar1) {
          QDateTimeParser::setDigit
                    ((QDateTime *)&in_RSI->super_QDateTimeParser,(int)&local_50,in_EDX);
        }
      }
    }
    else {
      QDateTimeParser::setDigit((QDateTime *)&in_RSI->super_QDateTimeParser,(int)&local_50,in_EDX);
      local_f0.super_QFlagsStorage<QDateTimeParser::Section>.i =
           (QFlagsStorage<QDateTimeParser::Section>)
           ::operator&((enum_type)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                       (enum_type)in_stack_fffffffffffffcd0);
      bVar2 = QFlags<QDateTimeParser::Section>::operator!
                        ((QFlags<QDateTimeParser::Section> *)&local_f0);
      bVar1 = false;
      if (bVar2) {
        local_f4.super_QFlagsStorage<QDateTimeEdit::Section>.i =
             (QFlagsStorage<QDateTimeEdit::Section>)
             QFlags<QDateTimeEdit::Section>::operator&
                       ((QFlags<QDateTimeEdit::Section> *)in_stack_fffffffffffffcd0,
                        (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
        IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_f4);
        bVar1 = IVar6 != 0;
      }
      if (bVar1) {
        local_100 = QDateTime::date();
        local_108 = *(undefined8 *)&in_RSI->field_0x468;
        local_f8 = QDate::daysInMonth(&local_100,local_108);
        local_110 = QDateTime::date();
        local_118 = *(undefined8 *)&in_RSI->field_0x468;
        iVar7 = QDate::day(&local_110,local_118);
        bVar1 = false;
        if (iVar7 < local_b0) {
          local_120 = QDateTime::date();
          local_128 = *(undefined8 *)&in_RSI->field_0x468;
          iVar7 = QDate::day(&local_120,local_128);
          bVar1 = iVar7 < local_f8;
        }
        if (bVar1) {
          qMin<int>(&local_b0,&local_f8);
          local_138 = QDateTime::date();
          local_140 = *(undefined8 *)&in_RSI->field_0x468;
          QDate::day(&local_138,local_140);
          QDateTime::addDays((longlong)local_130);
          QDateTime::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
          QDateTime::~QDateTime(local_130);
        }
      }
      bVar1 = ::operator<(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      if (bVar1) {
        QDateTimeParser::setDigit((QDateTime *)&in_RSI->super_QDateTimeParser,(int)&local_50,in_EDX)
        ;
        bVar1 = ::operator<(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
        if (bVar1) {
          QDateTimeParser::setDigit
                    ((QDateTime *)&in_RSI->super_QDateTimeParser,(int)&local_50,in_EDX);
        }
      }
    }
  }
  iVar7 = local_b0;
  local_2a5 = false;
  if ((in_R8B & 1) == 0) {
    local_1a0 = QDateTime::date();
    local_1a8 = *(undefined8 *)&in_RSI->field_0x468;
    iVar3 = QDate::day(&local_1a0,local_1a8);
    local_2a5 = false;
    if (iVar7 != iVar3) {
      local_1ac.super_QFlagsStorage<QDateTimeParser::Section>.i =
           (QFlagsStorage<QDateTimeParser::Section>)
           ::operator&((enum_type)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                       (enum_type)in_stack_fffffffffffffcd0);
      local_2a5 = QFlags<QDateTimeParser::Section>::operator!
                            ((QFlags<QDateTimeParser::Section> *)&local_1ac);
    }
  }
  if (local_2a5 != false) {
    piVar10 = qMax<int>(&local_b0,(int *)&in_RSI->field_0x3ec);
    *(int *)&in_RSI->field_0x3ec = *piVar10;
  }
  bVar1 = ::operator<(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  if (bVar1) {
    if ((*(ushort *)&(in_RSI->super_QAbstractSpinBoxPrivate).field_0x3d0 >> 2 & 1) == 0) {
      ::QVariant::toDateTime();
      QDateTime::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      QDateTime::~QDateTime(local_1c0);
    }
    else {
      local_1b8 = &DAT_aaaaaaaaaaaaaaaa;
      QDateTime::QDateTime((QDateTime *)&local_1b8,(QDateTime *)&local_50);
      QDateTimeParser::setDigit((QDateTime *)&in_RSI->super_QDateTimeParser,(int)&local_1b8,in_EDX);
      local_231 = operator>=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      local_232 = operator<=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      if ((!local_231) || (!local_232)) {
        if (in_ECX < 0) {
          local_2e0 = (int)&local_e8;
        }
        else {
          local_2e0 = (int)&local_e0;
        }
        QDateTimeParser::getDigit((QDateTime *)&in_RSI->super_QDateTimeParser,local_2e0);
        QDateTimeParser::setDigit
                  ((QDateTime *)&in_RSI->super_QDateTimeParser,(int)&local_1b8,in_EDX);
        local_231 = operator>=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
        local_232 = operator<=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      }
      if ((local_231 != false) && (local_232 != false)) {
        QDateTime::operator=((QDateTime *)&local_50,(QDateTime *)&local_1b8);
      }
      QDateTime::~QDateTime((QDateTime *)&local_1b8);
    }
  }
  else {
    bVar1 = operator>(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    if (bVar1) {
      if ((*(ushort *)&(in_RSI->super_QAbstractSpinBoxPrivate).field_0x3d0 >> 2 & 1) == 0) {
        ::QVariant::toDateTime();
        QDateTime::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
        QDateTime::~QDateTime(local_1d0);
      }
      else {
        local_1c8 = &DAT_aaaaaaaaaaaaaaaa;
        QDateTime::QDateTime((QDateTime *)&local_1c8,(QDateTime *)&local_50);
        QDateTimeParser::setDigit
                  ((QDateTime *)&in_RSI->super_QDateTimeParser,(int)&local_1c8,in_EDX);
        local_233 = operator>=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
        local_234 = operator<=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
        if ((!local_233) || (!local_234)) {
          if (in_ECX < 1) {
            local_318 = (int)&local_e8;
          }
          else {
            local_318 = (int)&local_e0;
          }
          QDateTimeParser::getDigit((QDateTime *)&in_RSI->super_QDateTimeParser,local_318);
          QDateTimeParser::setDigit
                    ((QDateTime *)&in_RSI->super_QDateTimeParser,(int)&local_1c8,in_EDX);
          local_233 = operator>=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
          local_234 = operator<=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
        }
        if ((local_233 != false) && (local_234 != false)) {
          QDateTime::operator=((QDateTime *)&local_50,(QDateTime *)&local_1c8);
        }
        QDateTime::~QDateTime((QDateTime *)&local_1c8);
      }
    }
  }
  this_02 = &local_48;
  this_03 = (QDateTime *)&local_50;
  ::QVariant::QVariant(this_02,this_03);
  this_01 = &local_28;
  (**(code **)(*(long *)&(in_RSI->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0xb8))
            (this_01,in_RSI,this_02,&(in_RSI->super_QAbstractSpinBoxPrivate).value,in_ECX);
  this_00 = local_1d8;
  ::QVariant::toDateTime();
  QDateTime::toTimeZone(in_RDI);
  QDateTime::~QDateTime(this_00);
  ::QVariant::~QVariant(this_01);
  ::QVariant::~QVariant(this_02);
  QDateTime::~QDateTime((QDateTime *)&local_e8);
  QDateTime::~QDateTime((QDateTime *)&local_e0);
  QString::~QString((QString *)0x55e8ea);
  QDateTime::~QDateTime(this_03);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDateTime QDateTimeEditPrivate::stepBy(int sectionIndex, int steps, bool test) const
{
    Q_Q(const QDateTimeEdit);
    QDateTime v = value.toDateTime();
    QString str = displayText();
    int pos = edit->cursorPosition();
    const SectionNode sn = sectionNode(sectionIndex);

    // to make sure it behaves reasonably when typing something and then stepping in non-tracking mode
    if (!test && pendingEmit && q->validate(str, pos) == QValidator::Acceptable)
        v = q->dateTimeFromText(str);
    int val = getDigit(v, sectionIndex);

    const int min = absoluteMin(sectionIndex);
    const int max = absoluteMax(sectionIndex, value.toDateTime());

    if (sn.type & DayOfWeekSectionMask) {
        // Must take locale's first day of week into account when *not*
        // wrapping; min and max don't help us.
#ifndef QT_ALWAYS_WRAP_WEEKDAY // (documentation, not an actual define)
        if (!wrapping) {
            /* It's not clear this is ever really a desirable behavior.

               It refuses to step backwards from the first day of the week or
               forwards from the day before, only allowing day-of-week stepping
               from start to end of one week. That's strictly what non-wrapping
               behavior must surely mean, when put in locale-neutral terms.

               It is, however, likely that users would prefer the "more natural"
               behavior of cycling through the week.
            */
            const int first = int(locale().firstDayOfWeek()); // Mon = 1 through 7 = Sun
            val = qBound(val < first ? first - 7 : first,
                         val + steps,
                         val < first ? first - 1 : first + 6);
        } else
#endif
        {
            val += steps;
        }

        // Restore to range from 1 through 7:
        val = val % 7;
        if (val <= 0)
            val += 7;
    } else {
        val += steps;
        const int span = max - min + 1;
        if (val < min)
            val = wrapping ? val + span : min;
        else if (val > max)
            val = wrapping ? val - span : max;
    }

    const int oldDay = v.date().day(calendar);

    /*
        Stepping into a daylight saving time that doesn't exist (setDigit() is
        true when date and time are valid, even if the date-time returned
        isn't), so use the time that has the same distance from epoch.
    */
    if (setDigit(v, sectionIndex, val) && getDigit(v, sectionIndex) != val
        && sn.type & HourSectionMask && steps < 0) {
        // decreasing from e.g 3am to 2am would get us back to 3am, but we want 1am
        auto msecsSinceEpoch = v.toMSecsSinceEpoch() - 3600 * 1000;
        v = QDateTime::fromMSecsSinceEpoch(msecsSinceEpoch, v.timeRepresentation());
    }
    // if this sets year or month it will make
    // sure that days are lowered if needed.

    const QDateTime minimumDateTime = minimum.toDateTime();
    const QDateTime maximumDateTime = maximum.toDateTime();
    // changing one section should only modify that section, if possible
    if (sn.type != AmPmSection && !(sn.type & DayOfWeekSectionMask)
        && (v < minimumDateTime || v > maximumDateTime)) {
        const int localmin = getDigit(minimumDateTime, sectionIndex);
        const int localmax = getDigit(maximumDateTime, sectionIndex);

        if (wrapping) {
            // just because we hit the roof in one direction, it
            // doesn't mean that we hit the floor in the other
            if (steps > 0) {
                setDigit(v, sectionIndex, min);
                if (!(sn.type & DaySectionMask) && sections & DateSectionMask) {
                    const int daysInMonth = v.date().daysInMonth(calendar);
                    if (v.date().day(calendar) < oldDay && v.date().day(calendar) < daysInMonth) {
                        const int adds = qMin(oldDay, daysInMonth);
                        v = v.addDays(adds - v.date().day(calendar));
                    }
                }

                if (v < minimumDateTime) {
                    setDigit(v, sectionIndex, localmin);
                    if (v < minimumDateTime)
                        setDigit(v, sectionIndex, localmin + 1);
                }
            } else {
                setDigit(v, sectionIndex, max);
                if (!(sn.type & DaySectionMask) && sections & DateSectionMask) {
                    const int daysInMonth = v.date().daysInMonth(calendar);
                    if (v.date().day(calendar) < oldDay && v.date().day(calendar) < daysInMonth) {
                        const int adds = qMin(oldDay, daysInMonth);
                        v = v.addDays(adds - v.date().day(calendar));
                    }
                }

                if (v > maximumDateTime) {
                    setDigit(v, sectionIndex, localmax);
                    if (v > maximumDateTime)
                        setDigit(v, sectionIndex, localmax - 1);
                }
            }
        } else {
            setDigit(v, sectionIndex, (steps > 0 ? localmax : localmin));
        }
    }
    if (!test && oldDay != v.date().day(calendar) && !(sn.type & DaySectionMask)) {
        // this should not happen when called from stepEnabled
        cachedDay = qMax<int>(oldDay, cachedDay);
    }

    if (v < minimumDateTime) {
        if (wrapping) {
            QDateTime t = v;
            setDigit(t, sectionIndex, steps < 0 ? max : min);
            bool mincmp = (t >= minimumDateTime);
            bool maxcmp = (t <= maximumDateTime);
            if (!mincmp || !maxcmp) {
                setDigit(t, sectionIndex, getDigit(steps < 0
                                                   ? maximumDateTime
                                                   : minimumDateTime, sectionIndex));
                mincmp = (t >= minimumDateTime);
                maxcmp = (t <= maximumDateTime);
            }
            if (mincmp && maxcmp) {
                v = t;
            }
        } else {
            v = value.toDateTime();
        }
    } else if (v > maximumDateTime) {
        if (wrapping) {
            QDateTime t = v;
            setDigit(t, sectionIndex, steps > 0 ? min : max);
            bool mincmp = (t >= minimumDateTime);
            bool maxcmp = (t <= maximumDateTime);
            if (!mincmp || !maxcmp) {
                setDigit(t, sectionIndex, getDigit(steps > 0 ?
                                                   minimumDateTime :
                                                   maximumDateTime, sectionIndex));
                mincmp = (t >= minimumDateTime);
                maxcmp = (t <= maximumDateTime);
            }
            if (mincmp && maxcmp) {
                v = t;
            }
        } else {
            v = value.toDateTime();
        }
    }

    return bound(v, value, steps).toDateTime().toTimeZone(timeZone);
}